

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,CallInst *CI,PSNode *arg,uint idx)

{
  bool bVar1;
  PSNode *pPVar2;
  undefined4 in_ECX;
  LLVMPointerGraphBuilder *in_RDX;
  SubgraphNode<dg::pta::PSNode> *in_RDI;
  PSNode *op;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  
  llvm::CallBase::getArgOperand((CallBase *)in_RDI,in_stack_ffffffffffffffcc);
  pPVar2 = tryGetOperand(in_RDX,(Value *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  if (pPVar2 != (PSNode *)0x0) {
    bVar1 = SubgraphNode<dg::pta::PSNode>::hasOperand
                      (in_RDI,(PSNode *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (!bVar1) {
      SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
                (in_RDI,(PSNode *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::CallInst *CI,
                                                  PSNode *arg, unsigned idx) {
    assert(idx < llvmutils::getNumArgOperands(CI));
    PSNode *op = tryGetOperand(CI->getArgOperand(idx));
    if (op && !arg->hasOperand(op)) {
        // NOTE: do not add an operand multiple-times
        // (when a function is called multiple-times with
        // the same actual parameters)
        arg->addOperand(op);
    }
}